

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall
libcellml::Importer::ImporterImpl::checkUnitsForCycles
          (ImporterImpl *this,UnitsPtr *units,History *history)

{
  IssueImpl *pIVar1;
  AnyCellmlElementImpl *pAVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  ulong index;
  ModelPtr model_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  History *local_168;
  IssuePtr issue_1;
  IssuePtr issue;
  UnitsPtr importedUnits;
  HistoryEpochPtr h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string resolvingUrl;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ModelPtr model;
  ModelPtr unitsModel;
  string local_70;
  string local_50;
  
  local_168 = history;
  bVar3 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  if (bVar3) {
    ImportedEntity::importSource((ImportedEntity *)&model_1);
    resolvingUrl_abi_cxx11_(&resolvingUrl,this,(ImportSourcePtr *)&model_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Units,void>
              ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&model_1,
               &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
    owningModel((ParentedEntityConstPtr *)&unitsModel);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Units,void>
              ((__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2> *)&local_188,
               &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
    modelUrl_abi_cxx11_((string *)&model_1,this,&unitsModel);
    createHistoryEpoch((libcellml *)&h,(UnitsConstPtr *)&local_188,(string *)&model_1,&resolvingUrl)
    ;
    std::__cxx11::string::~string((string *)&model_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
    ImportedEntity::importSource((ImportedEntity *)&local_188);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&model_1,"flatten",(allocator<char> *)&local_110);
    bVar4 = checkForImportCycles(this,(ImportSourcePtr *)&local_188,local_168,&h,(string *)&model_1)
    ;
    std::__cxx11::string::~string((string *)&model_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
    bVar3 = true;
    if (!bVar4) {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::push_back(local_168,&h);
      ImportedEntity::importSource((ImportedEntity *)&model_1);
      ImportSource::model((ImportSource *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_d0,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_NamedEntity);
        std::operator+(&local_b0,"Units \'",&local_d0);
        std::operator+(&local_110,&local_b0,"\' requires a model imported from \'");
        std::operator+(&local_188,&local_110,&resolvingUrl);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model_1
                       ,&local_188,"\' which is not available in the importer.");
        Issue::IssueImpl::setDescription(pIVar1,(string *)&model_1);
        std::__cxx11::string::~string((string *)&model_1);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        pAVar2 = (((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl;
        ImportedEntity::importSource((ImportedEntity *)&model_1);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar2,(ImportSourcePtr *)&model_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,IMPORTER_NULL_MODEL);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar3 = true;
      }
      else {
        ImportedEntity::importReference_abi_cxx11_
                  ((string *)&model_1,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ImportedEntity);
        Model::units((Model *)&importedUnits,
                     (string *)
                     model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::~string((string *)&model_1);
        if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_50,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"Units \'",&local_50);
          std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"\' imports units named \'");
          ImportedEntity::importReference_abi_cxx11_
                    (&local_70,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
          std::operator+(&local_b0,&local_d0,&local_70);
          std::operator+(&local_110,&local_b0,"\' from the model imported from \'");
          std::operator+(&local_188,&local_110,&resolvingUrl);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &model_1,&local_188,"\'. The units could not be found.");
          Issue::IssueImpl::setDescription(pIVar1,(string *)&model_1);
          std::__cxx11::string::~string((string *)&model_1);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&issue);
          std::__cxx11::string::~string((string *)&local_50);
          pAVar2 = (((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl;
          ImportedEntity::importSource((ImportedEntity *)&model_1);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    (pAVar2,(ImportSourcePtr *)&model_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Issue::IssueImpl::setReferenceRule
                    ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,IMPORTER_MISSING_UNITS);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          bVar3 = true;
        }
        else {
          bVar3 = checkUnitsForCycles(this,&importedUnits,local_168);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&resolvingUrl);
  }
  else {
    for (index = 0;
        sVar5 = Units::unitCount((units->
                                 super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr), index < sVar5; index = index + 1) {
      Units::unitAttributeReference_abi_cxx11_
                (&resolvingUrl,
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 index);
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Units,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                 &local_188,&units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                );
      owningModel((ParentedEntityConstPtr *)&model_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
      bVar3 = Model::hasUnits(model_1.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,&resolvingUrl);
      if (bVar3) {
        Model::units((Model *)&local_188,
                     (string *)
                     model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
        bVar3 = checkUnitsForCycles(this,(UnitsPtr *)&local_188,local_168);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
        if (bVar3) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&resolvingUrl);
          return true;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&resolvingUrl);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Importer::ImporterImpl::checkUnitsForCycles(const UnitsPtr &units, History &history)
{
    // Even if these units are not imported, they might have imported children.
    if (!units->isImport()) {
        for (size_t index = 0; index < units->unitCount(); ++index) {
            std::string ref = units->unitAttributeReference(index);
            // If the child units are imported, check them too.
            auto model = owningModel(units);
            if (model->hasUnits(ref)) {
                if (checkUnitsForCycles(model->units(ref), history)) {
                    return true;
                }
            }
        }
        return false;
    }

    // If they are imported, then they can't have any child unit elements anyway.
    std::string resolvingUrl = ImporterImpl::resolvingUrl(units->importSource());
    auto unitsModel = owningModel(units);
    auto h = createHistoryEpoch(units, modelUrl(unitsModel), resolvingUrl);

    if (checkForImportCycles(units->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = units->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedUnits = model->units(units->importReference());
    if (importedUnits == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' imports units named '" + units->importReference() + "' from the model imported from '" + resolvingUrl + "'. The units could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_UNITS);
        addIssue(issue);
        return true;
    }

    return checkUnitsForCycles(importedUnits, history);
}